

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O0

void __thiscall wasm::Type::Type(Type *this,HeapType heapType,Nullability nullable,Exactness exact)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TypeID TVar4;
  uint uVar5;
  Exactness exact_local;
  Nullability nullable_local;
  Type *this_local;
  HeapType heapType_local;
  
  this_local = (Type *)heapType.id;
  TVar4 = HeapType::getID((HeapType *)&this_local);
  iVar2 = 0;
  if (nullable == Nullable) {
    iVar2 = 2;
  }
  iVar3 = 0;
  if (exact == Exact) {
    iVar3 = 4;
  }
  Type(this,TVar4 | (long)iVar2 | (long)iVar3);
  TVar4 = HeapType::getID((HeapType *)&this_local);
  bVar1 = HeapType::isBasic((HeapType *)&this_local);
  uVar5 = 4;
  if (bVar1) {
    uVar5 = 0;
  }
  if ((TVar4 & (long)(int)(uVar5 | 3)) != 0) {
    __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
  }
  bVar1 = HeapType::isBasic((HeapType *)&this_local);
  if (bVar1 && exact != Inexact) {
    __assert_fail("!heapType.isBasic() || exact == Inexact",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x14d,"wasm::Type::Type(HeapType, Nullability, Exactness)");
  }
  return;
}

Assistant:

Type(HeapType heapType, Nullability nullable, Exactness exact = Inexact)
    : Type(heapType.getID() | (nullable == Nullable ? NullMask : 0) |
           (exact == Exact ? ExactMask : 0)) {
    assert(!(heapType.getID() &
             (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask))));
    assert(!heapType.isBasic() || exact == Inexact);
  }